

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O2

int bcf_update_format_string(bcf_hdr_t *hdr,bcf1_t *line,char *key,char **values,int n)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  undefined1 *values_00;
  undefined1 *puVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  undefined1 *puVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  
  if (n != 0) {
    uVar10 = 0;
    uVar5 = 0;
    if (0 < n) {
      uVar5 = (ulong)(uint)n;
    }
    uVar11 = 0;
    for (; uVar5 != uVar10; uVar10 = uVar10 + 1) {
      sVar3 = strlen(values[uVar10]);
      uVar6 = (uint)sVar3;
      if ((int)(uint)sVar3 < (int)uVar11) {
        uVar6 = uVar11;
      }
      uVar11 = uVar6;
    }
    values_00 = (undefined1 *)malloc((long)(int)(n * uVar11));
    if (values_00 == (undefined1 *)0x0) {
      iVar2 = -2;
    }
    else {
      puVar4 = values_00;
      for (uVar10 = 0; uVar10 != uVar5; uVar10 = uVar10 + 1) {
        pcVar1 = values[uVar10];
        uVar6 = 0;
        puVar8 = puVar4;
        for (uVar9 = 0; pcVar1[uVar9] != '\0'; uVar9 = uVar9 + 1) {
          puVar4[uVar9] = pcVar1[uVar9];
          uVar6 = uVar6 + 1;
          puVar8 = puVar8 + 1;
        }
        uVar7 = (ulong)uVar6;
        if ((int)uVar6 < (int)uVar11) {
          uVar7 = (ulong)uVar11;
        }
        for (; uVar9 != uVar7; uVar7 = uVar7 - 1) {
          *puVar8 = 0;
          puVar8 = puVar8 + 1;
        }
        puVar4 = puVar4 + uVar11;
      }
      iVar2 = bcf_update_format(hdr,line,key,values_00,n * uVar11,3);
      free(values_00);
    }
    return iVar2;
  }
  iVar2 = bcf_update_format(hdr,line,key,(void *)0x0,0,3);
  return iVar2;
}

Assistant:

int bcf_update_format_string(const bcf_hdr_t *hdr, bcf1_t *line, const char *key, const char **values, int n)
{
    if ( !n )
        return bcf_update_format(hdr,line,key,NULL,0,BCF_HT_STR);

    int i, max_len = 0;
    for (i=0; i<n; i++)
    {
        int len = strlen(values[i]);
        if ( len > max_len ) max_len = len;
    }
    char *out = (char*) malloc(max_len*n);
    if ( !out ) return -2;
    for (i=0; i<n; i++)
    {
        char *dst = out+i*max_len;
        const char *src = values[i];
        int j = 0;
        while ( src[j] ) { dst[j] = src[j]; j++; }
        for (; j<max_len; j++) dst[j] = 0;
    }
    int ret = bcf_update_format(hdr,line,key,out,max_len*n,BCF_HT_STR);
    free(out);
    return ret;
}